

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix4d *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::matrix4d> local_260;
  undefined1 local_1d8 [8];
  optional<tinyusdz::value::matrix4d> pv_1;
  optional<tinyusdz::value::matrix4d> local_148;
  undefined1 local_c0 [8];
  optional<tinyusdz::value::matrix4d> pv;
  matrix4d *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (matrix4d *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00175a17;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 0x78),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 0x78));
  if (bVar1) {
    get_default_value<tinyusdz::value::matrix4d>(&local_148,this);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
    optional<tinyusdz::value::matrix4d,_0>
              ((optional<tinyusdz::value::matrix4d> *)local_c0,&local_148);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional(&local_148);
    pv_1.contained._124_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c0);
    if ((bool)pv_1.contained._124_1_) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                         ((optional<tinyusdz::value::matrix4d> *)local_c0);
      memcpy(v,pvVar2,0x80);
      this_local._7_1_ = 1;
    }
    pv_1.contained._125_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
              ((optional<tinyusdz::value::matrix4d> *)local_c0);
    if (pv_1.contained._124_4_ != 0) goto LAB_00175a17;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00175a17;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix4d,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<tinyusdz::value::matrix4d>(&local_260,this);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
      optional<tinyusdz::value::matrix4d,_0>
                ((optional<tinyusdz::value::matrix4d> *)local_1d8,&local_260);
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional(&local_260);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1d8);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                           ((optional<tinyusdz::value::matrix4d> *)local_1d8);
        memcpy(v,pvVar2,0x80);
        this_local._7_1_ = 1;
      }
      pv_1.contained._125_3_ = 0;
      pv_1.contained._124_1_ = bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
                ((optional<tinyusdz::value::matrix4d> *)local_1d8);
      if (pv_1.contained._124_4_ != 0) goto LAB_00175a17;
    }
    this_local._7_1_ = 0;
  }
LAB_00175a17:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }